

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  N_Vector uu;
  N_Vector up;
  long lVar3;
  UserData paVar4;
  N_Vector p_Var5;
  int linsolver;
  char *pcVar6;
  int iVar7;
  sunrealtype rtol;
  double dVar8;
  sunrealtype atol;
  void *mem;
  SUNContext ctx;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  void *local_80;
  undefined8 local_78;
  N_Vector local_70;
  undefined8 local_68;
  UserData local_60;
  double local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  sunrealtype local_38;
  
  local_80 = (void *)0x0;
  iVar1 = 0;
  if (1 < argc) {
    iVar1 = atoi(argv[1]);
  }
  uVar2 = SUNContext_Create(0,&local_78);
  if ((int)uVar2 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    uu = (N_Vector)N_VNew_Serial(100,local_78);
    if (uu == (N_Vector)0x0) {
      main_cold_10();
      return 1;
    }
    up = (N_Vector)N_VClone(uu);
    if (up == (N_Vector)0x0) {
      main_cold_9();
      return 1;
    }
    local_70 = (N_Vector)N_VClone(uu);
    if (local_70 == (N_Vector)0x0) {
      main_cold_8();
      return 1;
    }
    lVar3 = N_VClone(uu);
    if (lVar3 == 0) {
      main_cold_7();
      return 1;
    }
    paVar4 = (UserData)malloc(0x20);
    paVar4->pp = (N_Vector)0x0;
    if (paVar4 == (UserData)0x0) {
      main_cold_6();
      return 1;
    }
    paVar4->mm = 10;
    paVar4->dx = 0.1111111111111111;
    paVar4->coeff = 81.0;
    p_Var5 = (N_Vector)N_VClone(uu);
    paVar4->pp = p_Var5;
    if (p_Var5 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    SetInitialProfile(paVar4,uu,up,local_70);
    N_VConst(0x3ff0000000000000,lVar3);
    local_80 = (void *)IDACreate(local_78);
    if (local_80 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    uVar2 = IDASetUserData(local_80,paVar4);
    if ((int)uVar2 < 0) {
      pcVar6 = "IDASetUserData";
    }
    else {
      uVar2 = IDASetConstraints(local_80,lVar3);
      if ((int)uVar2 < 0) {
        pcVar6 = "IDASetConstraints";
      }
      else {
        N_VDestroy(lVar3);
        uVar2 = IDAInit(0,local_80,resHeat,uu,up);
        if ((int)uVar2 < 0) {
          pcVar6 = "IDAInit";
        }
        else {
          local_68 = 0;
          atol = 0.001;
          uVar2 = IDASStolerances(local_80);
          if (-1 < (int)uVar2) {
            if (iVar1 == 2) {
              local_68 = 0xbff0000000000000;
            }
            if (iVar1 == 1) {
              local_68 = 0x4024000000000000;
            }
            lVar3 = 0;
            iVar1 = 0;
            local_60 = paVar4;
            do {
              if (iVar1 != 0) {
                SetInitialProfile(local_60,uu,up,local_70);
                uVar2 = IDAReInit(0,local_80,uu,up);
                if ((int)uVar2 < 0) {
                  pcVar6 = "IDAReInit";
                  goto LAB_00102a58;
                }
              }
              SUNLinSolFree(lVar3);
              if (iVar1 == 2) {
                printf(" ---------");
                puts(" \n| SPTFQMR |");
                puts(" ---------");
                lVar3 = SUNLinSol_SPTFQMR(uu,1,0,local_78);
                if (lVar3 == 0) {
                  main_cold_1();
                  return 1;
                }
LAB_00102857:
                uVar2 = IDASetLinearSolver(local_80,lVar3,0);
                if ((int)uVar2 < 0) {
                  pcVar6 = "IDASetLinearSolver";
                  goto LAB_00102a58;
                }
              }
              else {
                if (iVar1 == 1) {
                  printf(" -------");
                  puts(" \n| SPBCGS |");
                  puts(" -------");
                  lVar3 = SUNLinSol_SPBCGS(uu,1,0,local_78);
                  if (lVar3 == 0) {
                    main_cold_2();
                    return 1;
                  }
                  goto LAB_00102857;
                }
                if (iVar1 == 0) {
                  printf(" -------");
                  puts(" \n| SPGMR |");
                  puts(" -------");
                  lVar3 = SUNLinSol_SPGMR(uu,1,0,local_78);
                  if (lVar3 == 0) {
                    main_cold_3();
                    return 1;
                  }
                  goto LAB_00102857;
                }
              }
              uVar2 = IDASetPreconditioner(local_80,PsetupHeat,PsolveHeat);
              if ((int)uVar2 < 0) {
                pcVar6 = "IDASetPreconditioner";
                goto LAB_00102a58;
              }
              uVar2 = IDASetLSNormFactor(local_68,local_80);
              if ((int)uVar2 < 0) {
                pcVar6 = "IDASetLSNormFactor";
                goto LAB_00102a58;
              }
              PrintHeader(rtol,atol,iVar1);
              puts("\n   Output Summary (umax = max-norm of solution) \n");
              puts("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps");
              puts("----------------------------------------------------------------------");
              iVar7 = 0xb;
              dVar8 = 0.01;
              do {
                local_58 = dVar8;
                uVar2 = IDASolve(local_80,&local_38,uu,up,1);
                if ((int)uVar2 < 0) {
                  pcVar6 = "IDASolve";
                  goto LAB_00102a58;
                }
                PrintOutput(local_80,local_38,uu,linsolver);
                dVar8 = local_58 + local_58;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
              uVar2 = IDAGetNumErrTestFails(local_80,&local_40);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                        "IDAGetNumErrTestFails",(ulong)uVar2);
              }
              uVar2 = IDAGetNumNonlinSolvConvFails(local_80,&local_48);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                        "IDAGetNumNonlinSolvConvFails",(ulong)uVar2);
              }
              uVar2 = IDAGetNumLinConvFails(local_80,&local_50);
              if ((int)uVar2 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                        "IDAGetNumLinConvFails",(ulong)uVar2);
              }
              printf("\nError test failures            = %ld\n",local_40);
              printf("Nonlinear convergence failures = %ld\n",local_48);
              printf("Linear convergence failures    = %ld\n",local_50);
              if (iVar1 != 2) {
                puts("\n======================================================================\n");
              }
              iVar1 = iVar1 + 1;
              if (iVar1 == 3) {
                IDAFree(&local_80);
                SUNLinSolFree(lVar3);
                N_VDestroy(uu);
                N_VDestroy(up);
                N_VDestroy(local_70);
                paVar4 = local_60;
                N_VDestroy(local_60->pp);
                free(paVar4);
                SUNContext_Free(&local_78);
                return 0;
              }
            } while( true );
          }
          pcVar6 = "IDASStolerances";
        }
      }
    }
  }
LAB_00102a58:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout, linsolver;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  SUNContext ctx;

  mem         = NULL;
  data        = NULL;
  uu          = NULL;
  up          = NULL;
  constraints = NULL;
  res         = NULL;
  LS          = NULL;
  nrmfactor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* START: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 3; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize uu, up. */
      SetInitialProfile(data, uu, up, res);

      /* Re-initialize IDA */
      retval = IDAReInit(mem, t0, uu, up);
      if (check_retval(&retval, "IDAReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Specify preconditioner */
    retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
    if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = IDASetLSNormFactor(mem, nrmfac);
    if (check_retval(&retval, "IDASetLSNormFactor", 1)) { return (1); }

    /* Print output heading. */
    PrintHeader(rtol, atol, linsolver);

    /* Print output table heading, and initial line of table. */

    printf("\n   Output Summary (umax = max-norm of solution) \n\n");
    printf("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe "
           "nps\n");
    printf("-------------------------------------------------------------------"
           "---\n");

    /* Loop over output times, call IDASolve, and print results. */

    for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
    {
      retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
      if (check_retval(&retval, "IDASolve", 1)) { return (1); }
      PrintOutput(mem, tret, uu, linsolver);
    }

    /* Print remaining counters. */
    retval = IDAGetNumErrTestFails(mem, &netf);
    check_retval(&retval, "IDAGetNumErrTestFails", 1);

    retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
    check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

    retval = IDAGetNumLinConvFails(mem, &ncfl);
    check_retval(&retval, "IDAGetNumLinConvFails", 1);

    printf("\nError test failures            = %ld\n", netf);
    printf("Nonlinear convergence failures = %ld\n", ncfn);
    printf("Linear convergence failures    = %ld\n", ncfl);

    if (linsolver < 2)
    {
      printf("\n==============================================================="
             "=======\n\n");
    }

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}